

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,0,-1,1>>::
resizeLike<Eigen::Product<Eigen::TriangularView<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>,_1,_1,false>const>const,6u>,Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,0>>
          (PlainObjectBase<Eigen::Matrix<float,_1,_1,0,_1,1>> *this,
          EigenBase<Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>_>
          *_other)

{
  bool bVar1;
  Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>
  *this_00;
  Index IVar2;
  Index IVar3;
  Index othersize;
  Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>
  *other;
  EigenBase<Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_0>_>
  *_other_local;
  PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,_1>_> *this_local;
  bool error;
  long max_index;
  
  this_00 = EigenBase<Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_0>_>
            ::derived(_other);
  IVar2 = Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_0>
          ::rows(this_00);
  IVar3 = Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_0>
          ::cols(this_00);
  if ((IVar2 == 0) || (IVar3 == 0)) {
    bVar1 = false;
  }
  else {
    bVar1 = 0x7fffffffffffffff / IVar3 < IVar2;
  }
  if (bVar1) {
    internal::throw_std_bad_alloc();
  }
  Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_0>
  ::rows(this_00);
  Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_0>
  ::cols(this_00);
  IVar2 = Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_0>
          ::rows(this_00);
  IVar3 = Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>_>,_6U>,_Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_0>
          ::cols(this_00);
  PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,_1>_> *)this,IVar2,IVar3);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(other.rows(), other.cols());
      const Index othersize = other.rows()*other.cols();
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }